

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * cmTarget::GetTargetTypeName(TargetType targetType)

{
  char *pcStack_10;
  TargetType targetType_local;
  
  switch(targetType) {
  case EXECUTABLE:
    pcStack_10 = "EXECUTABLE";
    break;
  case STATIC_LIBRARY:
    pcStack_10 = "STATIC_LIBRARY";
    break;
  case SHARED_LIBRARY:
    pcStack_10 = "SHARED_LIBRARY";
    break;
  case MODULE_LIBRARY:
    pcStack_10 = "MODULE_LIBRARY";
    break;
  case OBJECT_LIBRARY:
    pcStack_10 = "OBJECT_LIBRARY";
    break;
  case UTILITY:
    pcStack_10 = "UTILITY";
    break;
  case GLOBAL_TARGET:
    pcStack_10 = "GLOBAL_TARGET";
    break;
  case INTERFACE_LIBRARY:
    pcStack_10 = "INTERFACE_LIBRARY";
    break;
  case UNKNOWN_LIBRARY:
    pcStack_10 = "UNKNOWN_LIBRARY";
    break;
  default:
    __assert_fail("0 && \"Unexpected target type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x3b,"static const char *cmTarget::GetTargetTypeName(TargetType)");
  }
  return pcStack_10;
}

Assistant:

const char* cmTarget::GetTargetTypeName(TargetType targetType)
{
  switch( targetType )
    {
      case cmTarget::STATIC_LIBRARY:
        return "STATIC_LIBRARY";
      case cmTarget::MODULE_LIBRARY:
        return "MODULE_LIBRARY";
      case cmTarget::SHARED_LIBRARY:
        return "SHARED_LIBRARY";
      case cmTarget::OBJECT_LIBRARY:
        return "OBJECT_LIBRARY";
      case cmTarget::EXECUTABLE:
        return "EXECUTABLE";
      case cmTarget::UTILITY:
        return "UTILITY";
      case cmTarget::GLOBAL_TARGET:
        return "GLOBAL_TARGET";
      case cmTarget::INTERFACE_LIBRARY:
        return "INTERFACE_LIBRARY";
      case cmTarget::UNKNOWN_LIBRARY:
        return "UNKNOWN_LIBRARY";
    }
  assert(0 && "Unexpected target type");
  return 0;
}